

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall
GEO::PeriodicDelaunay3dThread::insert(PeriodicDelaunay3dThread *this,index_t v,index_t *hint)

{
  uint uVar1;
  vector<unsigned_int> *pvVar2;
  bool bVar3;
  index_t iVar4;
  uint *puVar5;
  uint local_98;
  index_t tdel;
  index_t i_1;
  index_t i;
  index_t new_tet;
  bool ok;
  vec4 p_lifted;
  index_t f_bndry;
  index_t t_bndry;
  int nb_zero;
  index_t t;
  Sign orient [4];
  undefined1 local_40 [8];
  vec3 p;
  index_t *hint_local;
  PeriodicDelaunay3dThread *pPStack_18;
  index_t v_local;
  PeriodicDelaunay3dThread *this_local;
  
  if ((((v == this->v1_) || (v == this->v2_)) || (v == this->v3_)) || (v == this->v4_)) {
    this_local._7_1_ = true;
  }
  else {
    p.z = (double)hint;
    hint_local._4_4_ = v;
    pPStack_18 = this;
    vertex((vec3 *)local_40,this,v);
    iVar4 = locate(this,(index_t *)((long)&hint_local + 4),(vec3 *)local_40,*(index_t *)p.z,&nb_zero
                  );
    if (iVar4 == 0xffffffff) {
      this->nb_failed_locate_ = this->nb_failed_locate_ + 1;
      this_local._7_1_ = false;
    }
    else if ((byte)((nb_zero == 0) + (t == 0) + (orient[0] == ZERO) + (orient[1] == ZERO)) < 3) {
      p_lifted.w._4_4_ = 0xffffffff;
      p_lifted.w._0_4_ = 0xffffffff;
      lifted_vertex((vec4 *)&new_tet,this,hint_local._4_4_,(vec3 *)local_40);
      Cavity::clear(&this->cavity_);
      i._3_1_ = find_conflict_zone(this,hint_local._4_4_,(vec4 *)&new_tet,iVar4,
                                   (index_t *)((long)&p_lifted.w + 4),(index_t *)&p_lifted.w);
      if ((this->nb_free_ < this->nb_tets_to_create_) &&
         (bVar3 = Process::is_running_threads(), bVar3)) {
        this->memory_overflow_ = true;
        i._3_1_ = false;
      }
      if (i._3_1_ == false) {
        release_tets(this);
        this_local._7_1_ = false;
      }
      else {
        iVar4 = vector<unsigned_int>::size(&this->tets_to_delete_);
        if (iVar4 == 0) {
          release_tets(this);
          this->has_empty_cells_ = true;
          this_local._7_1_ = true;
        }
        else {
          bVar3 = Cavity::OK(&this->cavity_);
          if (bVar3) {
            i_1 = stellate_cavity(this,hint_local._4_4_);
          }
          else {
            i_1 = stellate_conflict_zone_iterative
                            (this,hint_local._4_4_,p_lifted.w._4_4_,p_lifted.w._0_4_,0xffffffff);
          }
          for (tdel = 0; iVar4 = vector<unsigned_int>::size(&this->tets_to_delete_),
              tdel < iVar4 - 1; tdel = tdel + 1) {
            puVar5 = vector<unsigned_int>::operator[](&this->tets_to_delete_,tdel + 1);
            uVar1 = *puVar5;
            pvVar2 = this->cell_next_;
            puVar5 = vector<unsigned_int>::operator[](&this->tets_to_delete_,tdel);
            puVar5 = vector<unsigned_int>::operator[](pvVar2,*puVar5);
            *puVar5 = uVar1;
          }
          uVar1 = this->first_free_;
          pvVar2 = this->cell_next_;
          iVar4 = vector<unsigned_int>::size(&this->tets_to_delete_);
          puVar5 = vector<unsigned_int>::operator[](&this->tets_to_delete_,iVar4 - 1);
          puVar5 = vector<unsigned_int>::operator[](pvVar2,*puVar5);
          *puVar5 = uVar1;
          puVar5 = vector<unsigned_int>::operator[](&this->tets_to_delete_,0);
          this->first_free_ = *puVar5;
          iVar4 = nb_tets_in_conflict(this);
          this->nb_free_ = iVar4 + this->nb_free_;
          for (local_98 = 0; iVar4 = vector<unsigned_int>::size(&this->tets_to_delete_),
              local_98 < iVar4; local_98 = local_98 + 1) {
            puVar5 = vector<unsigned_int>::operator[](&this->tets_to_delete_,local_98);
            iVar4 = *puVar5;
            set_tet_vertex(this,iVar4,0,-2);
            set_tet_vertex(this,iVar4,1,-2);
            set_tet_vertex(this,iVar4,2,-2);
            set_tet_vertex(this,iVar4,3,-2);
          }
          *(index_t *)p.z = i_1;
          release_tets(this);
          this_local._7_1_ = true;
        }
      }
    }
    else {
      release_tet(this,iVar4);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool insert(index_t v, index_t& hint) {

            // If v is one of the vertices of the
            // first tetrahedron, nothing to do.
            if(
                v == v1_ ||
                v == v2_ ||
                v == v3_ ||
                v == v4_
            ) {
                return true;
            }

	    vec3 p = vertex(v);
	    
            Sign orient[4];
            index_t t = locate(v,p,hint,orient);

            //   locate() may fail due to tets already owned by
            // other threads.
            if(t == NO_TETRAHEDRON) {
                ++nb_failed_locate_;
                geo_debug_assert(nb_acquired_tets_ == 0);
                return false;
            }

            //  At this point, t is a valid tetrahedron,
            // and this thread acquired a lock on it.

            // Test whether the point already exists in
            // the triangulation. The point already exists
            // if it's located on three faces of the
            // tetrahedron returned by locate().
            int nb_zero = 
                (orient[0] == ZERO) +
                (orient[1] == ZERO) +
                (orient[2] == ZERO) +
                (orient[3] == ZERO) ;

            if(nb_zero >= 3) {
                release_tet(t);
                return true;
            }

            geo_debug_assert(nb_acquired_tets_ == 1);

            index_t t_bndry = NO_TETRAHEDRON;
            index_t f_bndry = index_t(-1);

	    vec4 p_lifted = lifted_vertex(v,p);

	    cavity_.clear();
	    
            bool ok = find_conflict_zone(v,p_lifted,t,t_bndry,f_bndry);

            // When in multithreading mode, we cannot allocate memory
            // dynamically and we use a fixed pool. If the fixed pool
            // is full, then we exit the thread (and the missing points
            // are inserted after, in sequential mode).
            if(
                nb_tets_to_create_ > nb_free_ &&
                Process::is_running_threads()
            ) {
                memory_overflow_ = true;
                ok = false;
            }

            if(!ok) {
                //  At this point, this thread did not successfully
                // acquire all the tets in the conflict zone, so
                // we need to rollback.
                release_tets();
                geo_debug_assert(nb_acquired_tets_ == 0);
                return false;
            }

            // The conflict list can be empty if
            //  the triangulation is weighted and v is not visible
            if(tets_to_delete_.size() == 0) {
                release_tets();
                geo_debug_assert(nb_acquired_tets_ == 0);
		has_empty_cells_ = true;
                return true;
            }


            geo_debug_assert(
                nb_acquired_tets_ == 
                tets_to_delete_.size() + tets_to_release_.size()
            );

#ifdef GEO_DEBUG
            // Sanity check: make sure this threads owns all the tets 
            // in conflict and their neighbors.
            for(index_t i=0; i<tets_to_delete_.size(); ++i) {
                index_t tdel = tets_to_delete_[i];
                geo_debug_assert(owns_tet(tdel));
                for(index_t lf=0; lf<4; ++lf) {
                    geo_debug_assert(tet_adjacent(tdel,lf) >= 0);
                    geo_debug_assert(owns_tet(index_t(tet_adjacent(tdel,lf))));
                }
            }
#endif
            geo_debug_assert(owns_tet(t_bndry));
            geo_debug_assert(owns_tet(index_t(tet_adjacent(t_bndry,f_bndry))));
            geo_debug_assert(
                !tet_is_marked_as_conflict(
                    index_t(tet_adjacent(t_bndry,f_bndry))
                )
            );

            //   At this point, this threads owns all the tets in conflict and
            // their neighbors, therefore no other thread can interfere, and
            // we can update the triangulation.

            index_t new_tet = index_t(-1);
	    if(cavity_.OK()) {
		new_tet = stellate_cavity(v);	
	    } else {
		new_tet = stellate_conflict_zone_iterative(v,t_bndry,f_bndry);
	    }
       
            // Recycle the tetrahedra of the conflict zone.
            for(index_t i=0; i<tets_to_delete_.size()-1; ++i) {
                cell_next_[tets_to_delete_[i]] = tets_to_delete_[i+1];
            }
            cell_next_[tets_to_delete_[tets_to_delete_.size()-1]] =
                first_free_;
            first_free_ = tets_to_delete_[0];
            nb_free_ += nb_tets_in_conflict();

	    // Reset deleted tet.
	    // This is needed because we update_v_to_cell() in
	    // a transient state.
	    // Note: update_v_to_cell() is overloaded here,
	    // with a check on nb_vertices_non_periodic_,
	    // this is why the (-2) does not make everything crash.
            for(index_t i=0; i<tets_to_delete_.size(); ++i) {
                index_t tdel = tets_to_delete_[i];
                set_tet_vertex(tdel,0,-2);
                set_tet_vertex(tdel,1,-2);
                set_tet_vertex(tdel,2,-2);
                set_tet_vertex(tdel,3,-2);
            }
       
            // Return one of the newly created tets
            hint=new_tet;
            release_tets();
            geo_debug_assert(nb_acquired_tets_ == 0);
            return true;
        }